

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

void __thiscall HdlcAnalyzer::SetupAnalyzer(HdlcAnalyzer *this)

{
  uint uVar1;
  U32 UVar2;
  BitState BVar3;
  AnalyzerChannelData *pAVar4;
  element_type *peVar5;
  ulong uVar6;
  double dVar7;
  double halfPeriod;
  HdlcAnalyzer *this_local;
  
  std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
  pAVar4 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mHdlc = pAVar4;
  peVar5 = std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
  uVar1 = peVar5->mBitRate;
  UVar2 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar2;
  dVar7 = ((double)this->mSampleRateHz * (1.0 / (double)uVar1) * 1000000.0) / 1000000.0;
  uVar6 = (ulong)dVar7;
  this->mSamplesInHalfPeriod = uVar6 | (long)(dVar7 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f;
  this->mSamplesInAFlag = this->mSamplesInHalfPeriod * 7;
  this->mSamplesIn8Bits = (U32)(this->mSamplesInHalfPeriod << 3);
  BVar3 = AnalyzerChannelData::GetBitState();
  this->mPreviousBitState = BVar3;
  this->mConsecutiveOnes = 0;
  this->mReadingFrame = false;
  this->mAbortFrame = false;
  this->mCurrentFrameIsSFrame = false;
  this->mFoundEndFlag = false;
  std::vector<Frame,_std::allocator<Frame>_>::clear(&this->mResultFrames);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->mCurrentFrameBytes);
  return;
}

Assistant:

void HdlcAnalyzer::SetupAnalyzer()
{
    mHdlc = GetAnalyzerChannelData( mSettings->mInputChannel );

    double halfPeriod = ( 1.0 / double( mSettings->mBitRate ) ) * 1000000.0;
    mSampleRateHz = GetSampleRate();
    mSamplesInHalfPeriod = U64( ( mSampleRateHz * halfPeriod ) / 1000000.0 );
    mSamplesInAFlag = mSamplesInHalfPeriod * 7;
    mSamplesIn8Bits = mSamplesInHalfPeriod * 8;

    mPreviousBitState = mHdlc->GetBitState();
    mConsecutiveOnes = 0;
    mReadingFrame = false;
    mAbortFrame = false;
    mCurrentFrameIsSFrame = false;
    mFoundEndFlag = false;

    mResultFrames.clear();
    mCurrentFrameBytes.clear();
}